

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O1

void getQR(double *A,int M,int N,double *bvec,double *Q,double *R)

{
  long lVar1;
  size_t __size;
  bool bVar2;
  int iVar3;
  int iVar4;
  double *B;
  double *A_00;
  double *C;
  double *pdVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  double *pdVar12;
  double *pdVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  double dVar17;
  int N_1;
  double *local_78;
  ulong local_40;
  
  uVar15 = (ulong)M;
  __size = uVar15 * 8;
  B = (double *)malloc(__size);
  A_00 = (double *)malloc(__size * (long)N);
  C = (double *)malloc(__size * uVar15);
  uVar16 = (ulong)(uint)N;
  if (0 < N) {
    uVar6 = 0;
    pdVar13 = A;
    do {
      uVar9 = 0;
      do {
        if (uVar9 < uVar6) {
          R[uVar9] = 0.0;
        }
        else {
          R[uVar9] = pdVar13[uVar9];
        }
        uVar9 = uVar9 + 1;
      } while (uVar16 != uVar9);
      uVar6 = uVar6 + 1;
      R = R + uVar16;
      pdVar13 = pdVar13 + uVar16;
    } while (uVar6 != uVar16);
  }
  if (0 < M) {
    uVar6 = 0;
    uVar9 = 0;
    do {
      if (0 < N) {
        uVar11 = 0;
        do {
          dVar17 = 1.0;
          if (uVar9 != uVar11) {
            dVar17 = 0.0;
          }
          Q[uVar6 + uVar11] = dVar17;
          uVar11 = uVar11 + 1;
        } while (uVar16 != uVar11);
      }
      uVar9 = uVar9 + 1;
      uVar6 = (ulong)(uint)((int)uVar6 + N);
    } while (uVar9 != (uint)M);
  }
  if (0 < N) {
    iVar8 = M - N;
    pdVar12 = (double *)((long)A + (uVar16 * 8 + 8) * uVar16 + -8);
    uVar6 = uVar16 * 8 ^ 0xfffffffffffffff8;
    pdVar13 = Q + uVar16 * uVar16;
    local_78 = Q + uVar16 * uVar16 + -1;
    iVar3 = 1;
    lVar14 = 0;
    local_40 = uVar16;
    do {
      iVar8 = iVar8 + 1;
      *B = 1.0;
      if ((long)local_40 < (long)uVar15) {
        lVar7 = 0;
        pdVar5 = pdVar12;
        do {
          B[lVar7 + 1] = *pdVar5;
          pdVar5 = pdVar5 + uVar16;
          lVar1 = local_40 + lVar7;
          lVar7 = lVar7 + 1;
        } while (lVar1 + 1 < (long)uVar15);
      }
      uVar9 = local_40 - 1;
      if ((long)local_40 <= (long)uVar15) {
        iVar4 = 0;
        pdVar5 = pdVar13;
        uVar11 = uVar9;
        do {
          if ((long)local_40 <= (long)uVar16) {
            lVar7 = -1;
            iVar10 = iVar4;
            do {
              A_00[iVar10] = pdVar5[lVar7];
              iVar10 = iVar10 + iVar8;
              lVar7 = lVar7 + 1;
            } while (lVar14 != lVar7);
          }
          uVar11 = uVar11 + 1;
          iVar4 = iVar4 + 1;
          pdVar5 = pdVar5 + uVar16;
        } while (uVar11 != uVar15);
      }
      iVar4 = N - (int)uVar9;
      iVar10 = M - (int)uVar9;
      mmult(A_00,B,C,iVar4,iVar10,1);
      dVar17 = bvec[uVar9];
      lVar7 = -1;
      do {
        C[lVar7 + 1] = C[lVar7 + 1] * dVar17;
        lVar7 = lVar7 + 1;
      } while (lVar14 != lVar7);
      mmult(B,C,A_00,iVar10,1,iVar4);
      if ((long)local_40 <= (long)uVar15) {
        iVar4 = 0;
        pdVar5 = local_78;
        uVar11 = uVar9;
        do {
          if ((long)local_40 <= (long)uVar16) {
            lVar7 = 0;
            do {
              pdVar5[lVar7] = pdVar5[lVar7] - A_00[iVar4 + (int)lVar7];
              lVar7 = lVar7 + 1;
            } while (lVar14 + 1 != lVar7);
          }
          uVar11 = uVar11 + 1;
          pdVar5 = pdVar5 + uVar16;
          iVar4 = iVar4 + iVar3;
        } while (uVar11 != uVar15);
      }
      pdVar12 = (double *)((long)pdVar12 + uVar6);
      pdVar13 = (double *)((long)pdVar13 + uVar6);
      lVar14 = lVar14 + 1;
      local_78 = (double *)((long)local_78 + uVar6);
      iVar3 = iVar3 + 1;
      bVar2 = 1 < (long)local_40;
      local_40 = uVar9;
    } while (bVar2);
  }
  free(B);
  free(A_00);
  free(C);
  return;
}

Assistant:

void getQR(double *A,int M,int N,double *bvec,double *Q, double *R) {
	int i,j,k,t,u;
	double *x,*v,*AT,*w;
	
	x = (double*) malloc(sizeof(double) * M);
	v = (double*) malloc(sizeof(double) * M);
	AT = (double*) malloc(sizeof(double) * M * N);
	w = (double*) malloc(sizeof(double) * M * M);
	
	for(i = 0; i < N;++i) {
		t = i *N;
		for(j = 0; j < N;++j) {
			if (i > j) {
				R[t+j] = 0.;
			} else {
				R[t+j] = A[t+j];
			}
		}
	}
	
	for(i = 0; i < M;++i) {
		t = i *N;
		for(j = 0; j < N;++j) {
			if (i == j) {
				Q[t+j] = 1.;
			} else {
				Q[t+j] = 0.;
			}
		}
	}
	
	for(j = N-1; j >= 0;--j) {
		v[0] = 1.;
		for(i=j+1;i < M;++i) {
			v[i-j] = A[i*N+j];
			
		}
		
		for (i=j; i < M; i++) {
			t = i * N;
			u = 0;
			for (k=j; k < N; k++) {
				AT[u+i-j] = Q[k+t];
				u+=(M-j);
			}
			
		}
	
		mmult(AT,v,w,N-j,M-j,1);
		scale(w,N-j,1,bvec[j]);
		mmult(v,w,AT,M-j,1,N-j);
		
		for (i=j; i < M; i++) {
			t = i *N;
			for (k=j; k < N; k++) {
				Q[t+k] -= AT[(i-j)*(N-j) + k - j];
			}
		}
	 
	}
	
	free(x);
	free(v);
	free(AT);
	free(w);
}